

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O0

int scan_event_line(cfg_file *cfg,rc_event *event)

{
  char *pcVar1;
  char *line;
  rc_event *event_local;
  cfg_file *cfg_local;
  
  pcVar1 = read_cfg_line(cfg);
  if (((pcVar1 == (char *)0x0) || (*pcVar1 == '\n')) || (*pcVar1 == '[')) {
    cfg_local._4_4_ = -1;
  }
  else {
    __isoc99_sscanf(pcVar1,"%d\t%d\t%f",event,&event->bps,&event->fps);
    _mpp_log_l((double)event->fps,4,0,"idx: %d, bps %u, fps: %f\n",0,(event->field_0).msec,
               event->bps);
    invalid_cfg_cache(cfg);
    cfg_local._4_4_ = 0;
  }
  return cfg_local._4_4_;
}

Assistant:

static int scan_event_line(struct cfg_file *cfg, struct rc_event *event)
{
    char *line = read_cfg_line(cfg);

    if (line != NULL && line[0] != '\n' && line[0] != '[') {
        sscanf(line, "%d\t%d\t%f",
               &event->idx, &event->bps, &event->fps);
        mpp_log("idx: %d, bps %u, fps: %f\n",
                event->idx, event->bps, event->fps);
        invalid_cfg_cache(cfg);
    } else {
        return -1;
    }

    return 0;
}